

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u8 minMaxQuery(sqlite3 *db,Expr *pFunc,ExprList **ppMinMax)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ExprList *pEVar4;
  long lVar5;
  u8 uVar6;
  u8 uVar7;
  
  pEVar4 = (pFunc->x).pList;
  if ((((pEVar4 == (ExprList *)0x0) || (pEVar4->nExpr != 1)) || ((pFunc->flags & 0x1000000) != 0))
     || ((db->dbOptFlags & 0x10000) != 0)) {
    return '\0';
  }
  lVar5 = 0;
  do {
    bVar1 = (pFunc->u).zToken[lVar5];
    bVar2 = "min"[lVar5];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_0019a6ec;
    }
    else if (""[bVar1] != ""[bVar2]) goto LAB_0019a6ec;
    lVar5 = lVar5 + 1;
  } while( true );
LAB_0019a735:
  if (bVar1 != bVar2) {
    return '\0';
  }
  uVar7 = '\x01';
  uVar6 = '\x02';
  goto LAB_0019a740;
LAB_0019a6ec:
  if (bVar1 != bVar2) {
    lVar5 = 0;
    do {
      bVar1 = (pFunc->u).zToken[lVar5];
      bVar2 = "max"[lVar5];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_0019a735;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_0019a735;
      lVar5 = lVar5 + 1;
    } while( true );
  }
  iVar3 = sqlite3ExprCanBeNull(pEVar4->a[0].pExpr);
  uVar7 = (iVar3 != 0) * '\x02';
  uVar6 = '\x01';
LAB_0019a740:
  pEVar4 = sqlite3ExprListDup(db,pEVar4,0);
  *ppMinMax = pEVar4;
  if (pEVar4 != (ExprList *)0x0) {
    pEVar4->a[0].fg.sortFlags = uVar7;
    return uVar6;
  }
  return uVar6;
}

Assistant:

static u8 minMaxQuery(sqlite3 *db, Expr *pFunc, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;      /* Return value */
  ExprList *pEList;                     /* Arguments to agg function */
  const char *zFunc;                    /* Name of aggregate function pFunc */
  ExprList *pOrderBy;
  u8 sortFlags = 0;

  assert( *ppMinMax==0 );
  assert( pFunc->op==TK_AGG_FUNCTION );
  assert( !IsWindowFunc(pFunc) );
  assert( ExprUseXList(pFunc) );
  pEList = pFunc->x.pList;
  if( pEList==0
   || pEList->nExpr!=1
   || ExprHasProperty(pFunc, EP_WinFunc)
   || OptimizationDisabled(db, SQLITE_MinMaxOpt)
  ){
    return eRet;
  }
  assert( !ExprHasProperty(pFunc, EP_IntValue) );
  zFunc = pFunc->u.zToken;
  if( sqlite3StrICmp(zFunc, "min")==0 ){
    eRet = WHERE_ORDERBY_MIN;
    if( sqlite3ExprCanBeNull(pEList->a[0].pExpr) ){
      sortFlags = KEYINFO_ORDER_BIGNULL;
    }
  }else if( sqlite3StrICmp(zFunc, "max")==0 ){
    eRet = WHERE_ORDERBY_MAX;
    sortFlags = KEYINFO_ORDER_DESC;
  }else{
    return eRet;
  }
  *ppMinMax = pOrderBy = sqlite3ExprListDup(db, pEList, 0);
  assert( pOrderBy!=0 || db->mallocFailed );
  if( pOrderBy ) pOrderBy->a[0].fg.sortFlags = sortFlags;
  return eRet;
}